

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2630:30)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2630:30)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Maybe<kj::OwnFd>_> *output_00;
  ExceptionOr<kj::Maybe<kj::OwnFd>_> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::OwnFd>_>_2 local_360;
  ExceptionOr<kj::Promise<kj::OwnFd>_> local_358;
  ExceptionOr<kj::Maybe<kj::OwnFd>_> local_1b0;
  
  output_00 = &local_1b0;
  local_1b0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1b0.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&output_00->super_ExceptionOrValue);
  if (local_1b0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_358,
               &local_1b0.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_358.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::OwnFd>_>::operator=
              ((ExceptionOr<kj::Promise<kj::OwnFd>_> *)output,&local_358);
    ExceptionOr<kj::Promise<kj::OwnFd>_>::~ExceptionOr(&local_358);
  }
  else if (local_1b0.value.ptr.isSet == true) {
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)&local_360.value,(Maybe<kj::OwnFd> *)output_00);
    local_358.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_358.value.ptr.isSet = true;
    local_358.value.ptr.field_1 = local_360;
    local_360 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::OwnFd>_>_2)0x0;
    ExceptionOr<kj::Promise<kj::OwnFd>_>::operator=
              ((ExceptionOr<kj::Promise<kj::OwnFd>_> *)output,&local_358);
    ExceptionOr<kj::Promise<kj::OwnFd>_>::~ExceptionOr(&local_358);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360.value);
  }
  ExceptionOr<kj::Maybe<kj::OwnFd>_>::~ExceptionOr(&local_1b0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }